

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O0

bool libwebm::vttdemux::WriteCuePayload(FILE *f,FrameParser *parser)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  int local_60;
  undefined1 local_48 [4];
  int e;
  string line;
  int count;
  FrameParser *parser_local;
  FILE *f_local;
  
  line.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_48);
  do {
    iVar1 = libwebvtt::LineReader::GetLine(&parser->super_LineReader,(string *)local_48);
    if (iVar1 < 0) {
      f_local._7_1_ = 0;
      local_60 = 1;
LAB_0011aeb3:
      std::__cxx11::string::~string((string *)local_48);
      if (local_60 != 1) {
        if ((int)line.field_2._12_4_ < 1) {
          f_local._7_1_ = 0;
        }
        else {
          f_local._7_1_ = 1;
        }
      }
      return (bool)(f_local._7_1_ & 1);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      local_60 = 2;
      goto LAB_0011aeb3;
    }
    uVar3 = std::__cxx11::string::c_str();
    iVar1 = fprintf((FILE *)f,"%s\n",uVar3);
    if (iVar1 < 0) {
      f_local._7_1_ = 0;
      local_60 = 1;
      goto LAB_0011aeb3;
    }
    line.field_2._12_4_ = line.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

bool vttdemux::WriteCuePayload(FILE* f, FrameParser* parser) {
  int count = 0;  // count of lines of payload text written to output file
  for (string line;;) {
    const int e = parser->GetLine(&line);

    if (e < 0)  // error (only -- we allow EOS here)
      return false;

    if (line.empty())  // TODO(matthewjheaney): retain this check?
      break;

    if (fprintf(f, "%s\n", line.c_str()) < 0)
      return false;

    ++count;
  }

  if (count <= 0)  // WebVTT cue requires non-empty payload
    return false;

  return true;
}